

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::AssertControlTask::~AssertControlTask(AssertControlTask *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~AssertControlTask((AssertControlTask *)0xb3d5f8);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

explicit AssertControlTask(KnownSystemName knownNameId) :
        SystemTaskBase(knownNameId), isFullMethod(name == "$assertcontrol") {}